

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeSIMDLoadStoreLane<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,SIMDLoadStoreLaneOp op,int bytes)

{
  Memarg memarg;
  SIMDLoadStoreLaneOp op_00;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *annotations_00;
  Index pos_00;
  ParseDefsCtx *this;
  bool bVar1;
  Err *pEVar2;
  Name *mem_00;
  Memarg *pMVar3;
  uchar *puVar4;
  _Optional_payload_base<unsigned_char> local_11a;
  undefined1 local_118 [6];
  optional<unsigned_char> lane;
  Err *err;
  Result<wasm::WATParser::Memarg> _val;
  Result<wasm::WATParser::Memarg> arg;
  undefined1 local_90 [8];
  MaybeResult<wasm::Name> mem;
  anon_class_48_6_2b818c79 retry;
  size_t reset;
  int bytes_local;
  SIMDLoadStoreLaneOp op_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseDefsCtx *pPStack_18;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  reset._0_4_ = bytes;
  reset._4_4_ = op;
  _bytes_local = annotations;
  annotations_local._4_4_ = pos;
  pPStack_18 = ctx;
  ctx_local = (ParseDefsCtx *)__return_storage_ptr__;
  retry.op = (SIMDLoadStoreLaneOp *)Lexer::getPos(&ctx->in);
  mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = pPStack_18;
  retry.ctx = (ParseDefsCtx *)&retry.op;
  retry.reset = &reset;
  retry.bytes = (int *)((long)&annotations_local + 4);
  retry.pos = (Index *)_bytes_local;
  retry.annotations =
       (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
       ((long)&reset + 4);
  maybeMemidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)local_90,pPStack_18);
  pEVar2 = MaybeResult<wasm::Name>::getErr((MaybeResult<wasm::Name> *)local_90);
  if (pEVar2 == (Err *)0x0) {
    memarg<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::WATParser::Memarg> *)
               ((long)&_val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20),pPStack_18
               ,(uint32_t)reset);
    Result<wasm::WATParser::Memarg>::Result
              ((Result<wasm::WATParser::Memarg> *)&err,
               (Result<wasm::WATParser::Memarg> *)
               ((long)&_val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20));
    pEVar2 = Result<wasm::WATParser::Memarg>::getErr((Result<wasm::WATParser::Memarg> *)&err);
    if (pEVar2 != (Err *)0x0) {
      wasm::Err::Err((Err *)local_118,pEVar2);
      Result<wasm::Ok>::Result(__return_storage_ptr__,(Err *)local_118);
      wasm::Err::~Err((Err *)local_118);
    }
    Result<wasm::WATParser::Memarg>::~Result((Result<wasm::WATParser::Memarg> *)&err);
    if (pEVar2 == (Err *)0x0) {
      local_11a = (_Optional_payload_base<unsigned_char>)Lexer::takeU8(&pPStack_18->in);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_11a);
      this = pPStack_18;
      pos_00 = annotations_local._4_4_;
      annotations_00 = _bytes_local;
      op_00 = reset._4_4_;
      if (bVar1) {
        mem_00 = MaybeResult<wasm::Name>::getPtr((MaybeResult<wasm::Name> *)local_90);
        pMVar3 = Result<wasm::WATParser::Memarg>::operator*
                           ((Result<wasm::WATParser::Memarg> *)
                            ((long)&_val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>
                                    .super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> +
                            0x20));
        memarg = *pMVar3;
        puVar4 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)&local_11a);
        ParseDefsCtx::makeSIMDLoadStoreLane
                  (__return_storage_ptr__,this,pos_00,annotations_00,op_00,mem_00,memarg,*puVar4);
      }
      else {
        makeSIMDLoadStoreLane<wasm::WATParser::ParseDefsCtx>::anon_class_48_6_2b818c79::operator()
                  (__return_storage_ptr__,
                   (anon_class_48_6_2b818c79 *)
                   ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
      }
    }
    Result<wasm::WATParser::Memarg>::~Result
              ((Result<wasm::WATParser::Memarg> *)
               ((long)&_val.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20));
  }
  else {
    makeSIMDLoadStoreLane<wasm::WATParser::ParseDefsCtx>::anon_class_48_6_2b818c79::operator()
              (__return_storage_ptr__,
               (anon_class_48_6_2b818c79 *)
               ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::Name>::~MaybeResult((MaybeResult<wasm::Name> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeSIMDLoadStoreLane(Ctx& ctx,
                               Index pos,
                               const std::vector<Annotation>& annotations,
                               SIMDLoadStoreLaneOp op,
                               int bytes) {
  auto reset = ctx.in.getPos();

  auto retry = [&]() -> Result<> {
    // We failed to parse. Maybe the lane index was accidentally parsed as the
    // optional memory index. Try again without parsing a memory index.
    WithPosition with(ctx, reset);
    auto arg = memarg(ctx, bytes);
    CHECK_ERR(arg);
    auto lane = ctx.in.takeU8();
    if (!lane) {
      return ctx.in.err("expected lane index");
    }
    return ctx.makeSIMDLoadStoreLane(
      pos, annotations, op, nullptr, *arg, *lane);
  };

  auto mem = maybeMemidx(ctx);
  if (mem.getErr()) {
    return retry();
  }
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  auto lane = ctx.in.takeU8();
  if (!lane) {
    return retry();
  }
  return ctx.makeSIMDLoadStoreLane(
    pos, annotations, op, mem.getPtr(), *arg, *lane);
}